

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O2

int64_t helicsDataBufferToInteger(HelicsDataBuffer data)

{
  DataType baseType;
  SmallBuffer *pSVar1;
  int64_t val;
  int64_t local_30;
  data_view local_28;
  
  pSVar1 = getBuffer(data);
  if (pSVar1 == (SmallBuffer *)0x0) {
    local_30 = -0x8000000000000000;
  }
  else {
    local_28.dblock._M_len = pSVar1->bufferSize;
    local_28.dblock._M_str = (char *)pSVar1->heap;
    local_28.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_28.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    baseType = helics::detail::detectType((byte *)local_28.dblock._M_str);
    helics::valueExtract<long>(&local_28,baseType,&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_28.ref.
                super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return local_30;
}

Assistant:

int64_t helicsDataBufferToInteger(HelicsDataBuffer data)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return helics::invalidValue<int64_t>();
    }
    int64_t val;
    helics::valueExtract(helics::data_view(*ptr), helics::detail::detectType(ptr->data()), val);
    return val;
}